

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_encoder.c
# Opt level: O0

lzma_ret block_encode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  lzma_ret lVar4;
  uint32_t uVar5;
  size_t size;
  ulong in_size_00;
  bool bVar6;
  size_t check_size;
  size_t out_used;
  size_t in_used;
  lzma_ret ret;
  size_t out_start;
  size_t in_start;
  lzma_block_coder_conflict *coder;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  void *coder_ptr_local;
  
  if (0x7fffffffffffffffU - *(long *)((long)coder_ptr + 0x60) < in_size - *in_pos) {
    return LZMA_DATA_ERROR;
  }
  iVar1 = *(int *)((long)coder_ptr + 0x50);
  if (iVar1 == 0) {
    sVar2 = *in_pos;
    sVar3 = *out_pos;
    lVar4 = (**(code **)((long)coder_ptr + 0x18))
                      (*coder_ptr,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    size = *in_pos - sVar2;
    if (0x7ffffffffffffbbcU - *(long *)((long)coder_ptr + 0x58) < *out_pos - sVar3) {
      return LZMA_DATA_ERROR;
    }
    *(size_t *)((long)coder_ptr + 0x58) = (*out_pos - sVar3) + *(long *)((long)coder_ptr + 0x58);
    *(size_t *)((long)coder_ptr + 0x60) = size + *(long *)((long)coder_ptr + 0x60);
    lzma_check_update((lzma_check_state *)((long)coder_ptr + 0x70),
                      *(lzma_check *)(*(long *)((long)coder_ptr + 0x48) + 8),in + sVar2,size);
    if (lVar4 != LZMA_STREAM_END) {
      return lVar4;
    }
    if (action == LZMA_SYNC_FLUSH) {
      return LZMA_STREAM_END;
    }
    if (*in_pos != in_size) {
      __assert_fail("*in_pos == in_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/block_encoder.c"
                    ,0x56,
                    "lzma_ret block_encode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    if (action != LZMA_FINISH) {
      __assert_fail("action == LZMA_FINISH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/block_encoder.c"
                    ,0x57,
                    "lzma_ret block_encode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    *(undefined8 *)(*(long *)((long)coder_ptr + 0x48) + 0x10) =
         *(undefined8 *)((long)coder_ptr + 0x58);
    *(undefined8 *)(*(long *)((long)coder_ptr + 0x48) + 0x18) =
         *(undefined8 *)((long)coder_ptr + 0x60);
    *(undefined4 *)((long)coder_ptr + 0x50) = 1;
  }
  else if (iVar1 != 1) {
    if (iVar1 != 2) {
      return LZMA_PROG_ERROR;
    }
    goto LAB_006cc6da;
  }
  while ((*(ulong *)((long)coder_ptr + 0x58) & 3) != 0) {
    if (out_size <= *out_pos) {
      return LZMA_OK;
    }
    out[*out_pos] = '\0';
    *out_pos = *out_pos + 1;
    *(long *)((long)coder_ptr + 0x58) = *(long *)((long)coder_ptr + 0x58) + 1;
  }
  if (*(int *)(*(long *)((long)coder_ptr + 0x48) + 8) == 0) {
    return LZMA_STREAM_END;
  }
  lzma_check_finish((lzma_check_state *)((long)coder_ptr + 0x70),
                    *(lzma_check *)(*(long *)((long)coder_ptr + 0x48) + 8));
  *(undefined4 *)((long)coder_ptr + 0x50) = 2;
LAB_006cc6da:
  uVar5 = lzma_check_size(*(lzma_check *)(*(long *)((long)coder_ptr + 0x48) + 8));
  in_size_00 = (ulong)uVar5;
  lzma_bufcpy((uint8_t *)((long)coder_ptr + 0x70),(size_t *)((long)coder_ptr + 0x68),in_size_00,out,
              out_pos,out_size);
  bVar6 = in_size_00 <= *(ulong *)((long)coder_ptr + 0x68);
  if (bVar6) {
    memcpy((void *)(*(long *)((long)coder_ptr + 0x48) + 0x28),(void *)((long)coder_ptr + 0x70),
           in_size_00);
  }
  coder_ptr_local._4_4_ = (lzma_ret)bVar6;
  return coder_ptr_local._4_4_;
}

Assistant:

static lzma_ret
block_encode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_block_coder *coder = coder_ptr;

	// Check that our amount of input stays in proper limits.
	if (LZMA_VLI_MAX - coder->uncompressed_size < in_size - *in_pos)
		return LZMA_DATA_ERROR;

	switch (coder->sequence) {
	case SEQ_CODE: {
		const size_t in_start = *in_pos;
		const size_t out_start = *out_pos;

		const lzma_ret ret = coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);

		const size_t in_used = *in_pos - in_start;
		const size_t out_used = *out_pos - out_start;

		if (COMPRESSED_SIZE_MAX - coder->compressed_size < out_used)
			return LZMA_DATA_ERROR;

		coder->compressed_size += out_used;

		// No need to check for overflow because we have already
		// checked it at the beginning of this function.
		coder->uncompressed_size += in_used;

		lzma_check_update(&coder->check, coder->block->check,
				in + in_start, in_used);

		if (ret != LZMA_STREAM_END || action == LZMA_SYNC_FLUSH)
			return ret;

		assert(*in_pos == in_size);
		assert(action == LZMA_FINISH);

		// Copy the values into coder->block. The caller
		// may use this information to construct Index.
		coder->block->compressed_size = coder->compressed_size;
		coder->block->uncompressed_size = coder->uncompressed_size;

		coder->sequence = SEQ_PADDING;
	}

	// Fall through

	case SEQ_PADDING:
		// Pad Compressed Data to a multiple of four bytes. We can
		// use coder->compressed_size for this since we don't need
		// it for anything else anymore.
		while (coder->compressed_size & 3) {
			if (*out_pos >= out_size)
				return LZMA_OK;

			out[*out_pos] = 0x00;
			++*out_pos;
			++coder->compressed_size;
		}

		if (coder->block->check == LZMA_CHECK_NONE)
			return LZMA_STREAM_END;

		lzma_check_finish(&coder->check, coder->block->check);

		coder->sequence = SEQ_CHECK;

	// Fall through

	case SEQ_CHECK: {
		const size_t check_size = lzma_check_size(coder->block->check);
		lzma_bufcpy(coder->check.buffer.u8, &coder->pos, check_size,
				out, out_pos, out_size);
		if (coder->pos < check_size)
			return LZMA_OK;

		memcpy(coder->block->raw_check, coder->check.buffer.u8,
				check_size);
		return LZMA_STREAM_END;
	}
	}

	return LZMA_PROG_ERROR;
}